

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.cpp
# Opt level: O0

bool __thiscall spvtools::utils::BitVector::Or(BitVector *this,BitVector *other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  bool bVar4;
  reference puVar5;
  reference puVar6;
  const_iterator __last;
  bool local_81;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  const_iterator local_58;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  ulong local_48;
  unsigned_long temp;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  byte local_29;
  const_iterator cStack_28;
  bool modified;
  const_iterator other_it;
  iterator this_it;
  BitVector *other_local;
  BitVector *this_local;
  
  other_it._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->bits_);
  cStack_28 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&other->bits_);
  local_29 = 0;
  while( true ) {
    local_38._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->bits_);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)&other_it,&local_38);
    local_81 = false;
    if (bVar4) {
      temp = (unsigned_long)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&other->bits_);
      local_81 = __gnu_cxx::operator!=
                           (&stack0xffffffffffffffd8,
                            (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)&temp);
    }
    if (local_81 == false) break;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&other_it);
    uVar1 = *puVar5;
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&stack0xffffffffffffffd8);
    uVar2 = *puVar6;
    local_48 = uVar1 | uVar2;
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&other_it);
    uVar3 = local_48;
    if ((uVar1 | uVar2) != *puVar5) {
      local_29 = 1;
      puVar5 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&other_it);
      *puVar5 = uVar3;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&other_it);
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&stack0xffffffffffffffd8);
  }
  local_50._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&other->bits_);
  bVar4 = __gnu_cxx::operator!=(&stack0xffffffffffffffd8,&local_50);
  if (bVar4) {
    local_29 = 1;
    local_60._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->bits_);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                *)&local_58,&local_60);
    __first._M_current = cStack_28._M_current;
    __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&other->bits_);
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)this,local_58,__first,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last._M_current);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool BitVector::Or(const BitVector& other) {
  auto this_it = this->bits_.begin();
  auto other_it = other.bits_.begin();
  bool modified = false;

  while (this_it != this->bits_.end() && other_it != other.bits_.end()) {
    auto temp = *this_it | *other_it;
    if (temp != *this_it) {
      modified = true;
      *this_it = temp;
    }
    ++this_it;
    ++other_it;
  }

  if (other_it != other.bits_.end()) {
    modified = true;
    this->bits_.insert(this->bits_.end(), other_it, other.bits_.end());
  }

  return modified;
}